

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimeGenerator.cpp
# Opt level: O0

size_t __thiscall primesieve::PrimeGenerator::getStopIdx(PrimeGenerator *this)

{
  ulong uVar1;
  uint64_t uVar2;
  byte *pbVar3;
  array<unsigned_char,_720UL> *in_RDI;
  size_t stopIdx;
  size_type in_stack_ffffffffffffffd8;
  ulong local_10;
  
  uVar1 = *(ulong *)(in_RDI->_M_elems + 8);
  uVar2 = maxCachedPrime();
  if (uVar1 < uVar2) {
    pbVar3 = std::array<unsigned_char,_720UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    local_10 = (ulong)*pbVar3;
  }
  else {
    local_10 = std::array<unsigned_long,_128UL>::size
                         ((array<unsigned_long,_128UL> *)(anonymous_namespace)::smallPrimes);
  }
  return local_10;
}

Assistant:

size_t PrimeGenerator::getStopIdx() const
{
  size_t stopIdx = 0;

  if (stop_ < maxCachedPrime())
    stopIdx = primePi[stop_];
  else
    stopIdx = smallPrimes.size();

  return stopIdx;
}